

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Ok> *
wasm::WATParser::trytable<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  Lexer *this;
  undefined8 *puVar1;
  size_t sVar2;
  char *pcVar3;
  optional<wasm::Name> label_00;
  undefined3 uVar4;
  bool bVar5;
  _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err> *p_Var6;
  undefined7 in_register_00000009;
  _Alloc_hider _Var7;
  int iVar8;
  __index_type _Var9;
  undefined1 *puVar10;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  undefined1 local_180 [8];
  Result<wasm::HeapType> type;
  optional<wasm::Name> label;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  string local_120;
  string local_100;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_e0;
  size_t local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  undefined8 *local_b0;
  undefined1 auStack_a8 [8];
  vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  catches;
  undefined1 auStack_88 [8];
  MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> _val_1;
  undefined1 auStack_58 [8];
  MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> c;
  
  this = &ctx->in;
  local_d8 = (ctx->in).pos;
  catches.
  super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       (int)CONCAT71(in_register_00000009,folded);
  local_e0 = annotations;
  if (catches.
      super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
LAB_00c16781:
    expected_00._M_str = "try_table";
    expected_00._M_len = 9;
    bVar5 = Lexer::takeKeyword(this,expected_00);
    if (!bVar5) {
LAB_00c1680f:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
      return __return_storage_ptr__;
    }
  }
  else {
    expected._M_str = "try_table";
    expected._M_len = 9;
    bVar5 = Lexer::takeSExprStart(this,expected);
    if (!bVar5) goto LAB_00c1680f;
    if (catches.
        super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ == '\0') goto LAB_00c16781;
  }
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),this);
  blocktype<wasm::WATParser::ParseDefsCtx>((Result<wasm::HeapType> *)local_180,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)auStack_58,
             (_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)local_180);
  if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._24_1_ == '\x01') {
    puVar10 = (undefined1 *)
              ((long)&_val_1.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              + 8);
    auStack_88 = (undefined1  [8])puVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_88,auStack_58,
               (undefined1 *)
               (c.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._M_u._M_first._M_storage.tag.super_IString.str._M_len + (long)auStack_58));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if (auStack_88 == (undefined1  [8])puVar10) {
      *puVar1 = _val_1.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._M_u._M_first._M_storage.tag.super_IString.str._M_str;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = auStack_88;
      *(char **)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           _val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_str;
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_1.val.
         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
         ._M_u._M_first._M_storage.tag.super_IString.str._M_len;
    _val_1.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    _M_u._M_first._M_storage.tag.super_IString.str._M_len = 0;
    _val_1.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    _M_u._M_first._M_storage.tag.super_IString.str._M_str =
         (char *)((ulong)_val_1.val.
                         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         ._M_u._M_first._M_storage.tag.super_IString.str._M_str & 0xffffffffffffff00
                 );
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    auStack_88 = (undefined1  [8])puVar10;
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)auStack_58);
    goto LAB_00c16ab0;
  }
  _val_1.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  _32_8_ = this;
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)auStack_58);
  auStack_a8 = (undefined1  [8])0x0;
  catches.
  super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  catches.
  super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
  do {
    catchinstr<wasm::WATParser::ParseDefsCtx>
              ((MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> *)auStack_58,ctx);
    iVar8 = 3;
    if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._24_1_ != '\x01') {
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       *)auStack_88,
                      (_Copy_ctor_base<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       *)auStack_58);
      if (_val_1.val.
          super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
          ._M_u._24_1_ == '\x02') {
        local_d0 = &local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,auStack_88,
                   (undefined1 *)
                   (_val_1.val.
                    super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    ._M_u._M_first._M_storage.tag.super_IString.str._M_len + (long)auStack_88));
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
        if (local_d0 == &local_c0) {
          *local_b0 = CONCAT71(uStack_bf,local_c0);
          local_b0[1] = uStack_b8;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_d0;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(uStack_bf,local_c0);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_c8;
        local_c8 = 0;
        local_c0 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        local_d0 = &local_c0;
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           *)auStack_88);
        iVar8 = 1;
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           *)auStack_88);
        p_Var6 = (_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  *)0x0;
        if (c.val.
            super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
            .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
            .super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
            ._M_u._24_1_ == '\0') {
          p_Var6 = (_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    *)auStack_58;
        }
        _val_1.val.
        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._M_first._M_storage.tag.super_IString.str._M_str =
             (char *)*(undefined8 *)((long)&p_Var6->_M_u + 0x10);
        auStack_88 = (undefined1  [8])
                     (p_Var6->_M_u)._M_first._M_storage.tag.super_IString.str._M_len;
        _val_1.val.
        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._M_first._M_storage.tag.super_IString.str._M_len =
             *(size_t *)((long)&p_Var6->_M_u + 8);
        if (catches.
            super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            catches.
            super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<wasm::WATParser::ParseDefsCtx::CatchInfo,std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>>
          ::_M_realloc_insert<wasm::WATParser::ParseDefsCtx::CatchInfo_const&>
                    ((vector<wasm::WATParser::ParseDefsCtx::CatchInfo,std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>>
                      *)auStack_a8,
                     (iterator)
                     catches.
                     super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start,(CatchInfo *)auStack_88);
        }
        else {
          sVar2 = (p_Var6->_M_u)._M_first._M_storage.tag.super_IString.str._M_len;
          pcVar3 = (p_Var6->_M_u)._M_first._M_storage.tag.super_IString.str._M_str;
          bVar5 = *(bool *)((long)&p_Var6->_M_u + 0x14);
          uVar4 = *(undefined3 *)((long)&p_Var6->_M_u + 0x15);
          (catches.
           super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
           ._M_impl.super__Vector_impl_data._M_start)->label =
               *(Index *)((long)&p_Var6->_M_u + 0x10);
          (catches.
           super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
           ._M_impl.super__Vector_impl_data._M_start)->isRef = bVar5;
          *(undefined3 *)
           &(catches.
             super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
             ._M_impl.super__Vector_impl_data._M_start)->field_0x15 = uVar4;
          ((catches.
            super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
            ._M_impl.super__Vector_impl_data._M_start)->tag).super_IString.str._M_len = sVar2;
          ((catches.
            super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
            ._M_impl.super__Vector_impl_data._M_start)->tag).super_IString.str._M_str = pcVar3;
          catches.
          super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
          ._M_impl.super__Vector_impl_data._M_start =
               catches.
               super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        iVar8 = 0;
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       *)auStack_58);
  } while (iVar8 == 0);
  if (iVar8 != 3) goto LAB_00c16a95;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._17_7_ =
       label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._9_7_;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_engaged =
       (bool)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
       (char *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
  ;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
       type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
       super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_;
  ParseDefsCtx::makeTryTable
            ((Result<wasm::Ok> *)auStack_58,ctx,(Index)local_d8,local_e0,label_00,
             (HeapType)local_180,
             (vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
              *)auStack_a8);
  puVar1 = local_b0;
  if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._24_1_ == '\x01') {
    auStack_88 = (undefined1  [8])
                 ((long)&_val_1.val.
                         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_88,auStack_58,
               (undefined1 *)
               (c.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._M_u._M_first._M_storage.tag.super_IString.str._M_len + (long)auStack_58));
LAB_00c16a4e:
    puVar10 = (undefined1 *)
              ((long)&_val_1.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              + 8);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if (auStack_88 == (undefined1  [8])puVar10) {
      *puVar1 = _val_1.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._M_u._M_first._M_storage.tag.super_IString.str._M_str;
      puVar1[1] = _val_1.val.
                  super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  ._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = auStack_88;
      *(char **)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           _val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_str;
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_1.val.
         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
         ._M_u._M_first._M_storage.tag.super_IString.str._M_len;
    _val_1.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    _M_u._M_first._M_storage.tag.super_IString.str._M_len = 0;
    _val_1.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    _M_u._M_first._M_storage.tag.super_IString.str._M_str =
         (char *)((ulong)_val_1.val.
                         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         ._M_u._M_first._M_storage.tag.super_IString.str._M_str & 0xffffffffffffff00
                 );
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    auStack_88 = (undefined1  [8])puVar10;
LAB_00c16a8c:
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_58);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_58);
    instrs<wasm::WATParser::ParseDefsCtx>((Result<wasm::Ok> *)auStack_58,ctx);
    if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      auStack_88 = (undefined1  [8])
                   ((long)&_val_1.val.
                           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                   + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_88,auStack_58,
                 (undefined1 *)
                 (c.val.
                  super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  ._M_u._M_first._M_storage.tag.super_IString.str._M_len + (long)auStack_58));
      goto LAB_00c16a4e;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_58);
    if (catches.
        super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ != '\0') {
      bVar5 = Lexer::takeRParen((Lexer *)_val_1.val.
                                         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                         .
                                         super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                         ._32_8_);
      if (!bVar5) {
        label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._16_8_ = &local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged,
                   "expected \')\' at end of try_table","");
        Lexer::err((Err *)auStack_58,
                   (Lexer *)_val_1.val.
                            super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                            ._32_8_,
                   (string *)
                   &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        puVar10 = (undefined1 *)
                  ((long)&c.val.
                          super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  + 8);
        if (auStack_58 == (undefined1  [8])puVar10) {
          *puVar1 = CONCAT71(c.val.
                             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             ._M_u._9_7_,
                             c.val.
                             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             ._M_u._8_1_);
          puVar1[1] = c.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      ._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = auStack_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(c.val.
                        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        ._M_u._9_7_,
                        c.val.
                        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        ._M_u._8_1_);
        }
        *(size_t *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
             c.val.
             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             ._M_u._M_first._M_storage.tag.super_IString.str._M_len;
        c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._M_first._M_storage.tag.super_IString.str._M_len = 0;
        c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        local_120.field_2._M_allocated_capacity = local_130._M_allocated_capacity;
        _Var7._M_p = (pointer)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::Name>._16_8_;
        auStack_58 = (undefined1  [8])puVar10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_ != &local_130) goto LAB_00c16ca2;
        goto LAB_00c16a95;
      }
LAB_00c16b9b:
      ParseDefsCtx::visitEnd((Result<wasm::Ok> *)auStack_58,ctx);
      if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
          .super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
          .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
          ._M_u._24_1_ == '\x01') {
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        _Var9 = '\x02';
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,auStack_58,
                   (undefined1 *)
                   (c.val.
                    super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    ._M_u._M_first._M_storage.tag.super_IString.str._M_len + (long)auStack_58));
      }
      else {
        _Var9 = '\0';
      }
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = _Var9;
      goto LAB_00c16a8c;
    }
    expected_01._M_str = "end";
    expected_01._M_len = 3;
    bVar5 = Lexer::takeKeyword((Lexer *)_val_1.val.
                                        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                        .
                                        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                        .
                                        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                        ._32_8_,expected_01);
    if (bVar5) {
      Lexer::takeID((optional<wasm::Name> *)auStack_88,
                    (Lexer *)_val_1.val.
                             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             ._32_8_);
      if ((_val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._8_1_ != '\x01') ||
         ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
          (_val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_len ==
           label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len))))
      goto LAB_00c16b9b;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"end label does not match try_table label","");
      Lexer::err((Err *)auStack_58,
                 (Lexer *)_val_1.val.
                          super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          ._32_8_,&local_100);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      puVar10 = (undefined1 *)
                ((long)&c.val.
                        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                + 8);
      if (auStack_58 == (undefined1  [8])puVar10) {
        *puVar1 = CONCAT71(c.val.
                           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           ._M_u._9_7_,
                           c.val.
                           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           ._M_u._8_1_);
        puVar1[1] = c.val.
                    super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = auStack_58;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(c.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      ._M_u._9_7_,
                      c.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      ._M_u._8_1_);
      }
      *(size_t *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
           c.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_len;
      c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._M_first._M_storage.tag.super_IString.str._M_len = 0;
      c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      local_120.field_2._M_allocated_capacity = local_100.field_2._M_allocated_capacity;
      _Var7._M_p = local_100._M_dataplus._M_p;
      auStack_58 = (undefined1  [8])puVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) goto LAB_00c16ca2;
    }
    else {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"expected \'end\' at end of try_table","");
      Lexer::err((Err *)auStack_58,
                 (Lexer *)_val_1.val.
                          super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          ._32_8_,&local_120);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      puVar10 = (undefined1 *)
                ((long)&c.val.
                        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                + 8);
      if (auStack_58 == (undefined1  [8])puVar10) {
        *puVar1 = CONCAT71(c.val.
                           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           ._M_u._9_7_,
                           c.val.
                           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           ._M_u._8_1_);
        puVar1[1] = c.val.
                    super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = auStack_58;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(c.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      ._M_u._9_7_,
                      c.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      ._M_u._8_1_);
      }
      *(size_t *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
           c.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_len;
      c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._M_first._M_storage.tag.super_IString.str._M_len = 0;
      c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      _Var7._M_p = local_120._M_dataplus._M_p;
      auStack_58 = (undefined1  [8])puVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
LAB_00c16ca2:
        auStack_58 = (undefined1  [8])
                     ((long)&c.val.
                             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     + 8);
        c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._8_1_ = 0;
        c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._M_first._M_storage.tag.super_IString.str._M_len = 0;
        operator_delete(_Var7._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_00c16a95:
  if (auStack_a8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_a8,
                    (long)catches.
                          super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_a8);
  }
LAB_00c16ab0:
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_180);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<>
trytable(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("try_table"sv)) ||
      (!folded && !ctx.in.takeKeyword("try_table"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  auto catches = ctx.makeCatchList();
  while (auto c = catchinstr(ctx)) {
    CHECK_ERR(c);
    ctx.appendCatch(catches, *c);
  }

  CHECK_ERR(ctx.makeTryTable(pos, annotations, label, *type, catches));

  CHECK_ERR(instrs(ctx));

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of try_table");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of try_table");
    }

    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match try_table label");
    }
  }
  return ctx.visitEnd();
}